

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O1

void jpeg_idct_islow(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  int iVar1;
  int iVar2;
  int iVar3;
  JSAMPLE *pJVar4;
  void *pvVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  JSAMPLE JVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  JSAMPLE *pJVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  int aiStack_154 [7];
  int aiStack_138 [66];
  
  pJVar4 = cinfo->sample_range_limit;
  pvVar5 = compptr->dct_table;
  uVar13 = 9;
  lVar20 = 0;
  do {
    lVar11 = (long)*(short *)((long)coef_block + lVar20 + 0x10);
    if ((((lVar11 == 0) && (*(short *)((long)coef_block + lVar20 + 0x20) == 0)) &&
        (*(short *)((long)coef_block + lVar20 + 0x30) == 0)) &&
       (((*(short *)((long)coef_block + lVar20 + 0x40) == 0 &&
         (*(short *)((long)coef_block + lVar20 + 0x50) == 0)) &&
        ((*(short *)((long)coef_block + lVar20 + 0x60) == 0 &&
         (*(short *)((long)coef_block + lVar20 + 0x70) == 0)))))) {
      iVar7 = (int)*(short *)((long)coef_block + lVar20) * *(int *)((long)pvVar5 + lVar20 * 2) * 4;
      *(int *)((long)aiStack_154 + lVar20 * 2 + 0x1c) = iVar7;
      *(int *)((long)aiStack_154 + lVar20 * 2 + 0x3c) = iVar7;
      *(int *)((long)aiStack_154 + lVar20 * 2 + 0x5c) = iVar7;
      *(int *)((long)aiStack_154 + lVar20 * 2 + 0x7c) = iVar7;
      *(int *)((long)aiStack_154 + lVar20 * 2 + 0x9c) = iVar7;
      *(int *)((long)aiStack_154 + lVar20 * 2 + 0xbc) = iVar7;
      *(int *)((long)aiStack_154 + lVar20 * 2 + 0xdc) = iVar7;
      lVar11 = 0xe0;
    }
    else {
      lVar22 = (long)*(int *)((long)pvVar5 + lVar20 * 2 + 0x40) *
               (long)*(short *)((long)coef_block + lVar20 + 0x20);
      lVar24 = (long)*(int *)((long)pvVar5 + lVar20 * 2 + 0xc0) *
               (long)*(short *)((long)coef_block + lVar20 + 0x60);
      lVar8 = (lVar24 + lVar22) * 0x1151;
      lVar29 = lVar22 * 0x187e + lVar8;
      lVar8 = lVar24 * -0x3b21 + lVar8;
      lVar22 = (long)*(int *)((long)pvVar5 + lVar20 * 2 + 0x80) *
               (long)*(short *)((long)coef_block + lVar20 + 0x40);
      uVar25 = (long)*(int *)((long)pvVar5 + lVar20 * 2) *
               (long)*(short *)((long)coef_block + lVar20) * 0x2000;
      lVar23 = lVar22 * 0x2000 + uVar25 + 0x400;
      lVar26 = (uVar25 | 0x400) + lVar22 * -0x2000;
      lVar22 = lVar23 + lVar29;
      lVar23 = lVar23 - lVar29;
      lVar24 = lVar26 + lVar8;
      lVar26 = lVar26 - lVar8;
      lVar28 = (long)*(int *)((long)pvVar5 + lVar20 * 2 + 0xe0) *
               (long)*(short *)((long)coef_block + lVar20 + 0x70);
      lVar27 = (long)*(int *)((long)pvVar5 + lVar20 * 2 + 0xa0) *
               (long)*(short *)((long)coef_block + lVar20 + 0x50);
      lVar29 = (long)*(int *)((long)pvVar5 + lVar20 * 2 + 0x60) *
               (long)*(short *)((long)coef_block + lVar20 + 0x30);
      lVar11 = *(int *)((long)pvVar5 + lVar20 * 2 + 0x20) * lVar11;
      lVar8 = (lVar27 + lVar11 + lVar29 + lVar28) * 0x25a1;
      lVar16 = (lVar29 + lVar28) * -0x3ec5 + lVar8;
      lVar8 = (lVar27 + lVar11) * -0xc7c + lVar8;
      lVar15 = (lVar11 + lVar28) * -0x1ccd;
      lVar28 = lVar28 * 0x98e + lVar15 + lVar16;
      lVar15 = lVar11 * 0x300b + lVar15 + lVar8;
      lVar11 = (lVar29 + lVar27) * -0x5203;
      lVar8 = lVar27 * 0x41b3 + lVar11 + lVar8;
      lVar16 = lVar29 * 0x6254 + lVar11 + lVar16;
      *(int *)((long)aiStack_154 + lVar20 * 2 + 0x1c) = (int)((ulong)(lVar22 + lVar15) >> 0xb);
      *(int *)((long)aiStack_154 + lVar20 * 2 + 0xfc) = (int)((ulong)(lVar22 - lVar15) >> 0xb);
      *(int *)((long)aiStack_154 + lVar20 * 2 + 0x3c) = (int)((ulong)(lVar16 + lVar24) >> 0xb);
      *(int *)((long)aiStack_154 + lVar20 * 2 + 0xdc) = (int)((ulong)(lVar24 - lVar16) >> 0xb);
      *(int *)((long)aiStack_154 + lVar20 * 2 + 0x5c) = (int)((ulong)(lVar8 + lVar26) >> 0xb);
      *(int *)((long)aiStack_154 + lVar20 * 2 + 0xbc) = (int)((ulong)(lVar26 - lVar8) >> 0xb);
      *(int *)((long)aiStack_154 + lVar20 * 2 + 0x7c) = (int)((ulong)(lVar28 + lVar23) >> 0xb);
      iVar7 = (int)((ulong)(lVar23 - lVar28) >> 0xb);
      lVar11 = 0x80;
    }
    *(int *)((long)aiStack_154 + lVar20 * 2 + lVar11 + 0x1c) = iVar7;
    uVar13 = uVar13 - 1;
    lVar20 = lVar20 + 2;
  } while (1 < uVar13);
  lVar20 = 7;
  do {
    pJVar17 = (JSAMPLE *)(*(long *)((long)output_buf + lVar20 + -7) + (ulong)output_col);
    iVar7 = aiStack_154[lVar20 + 1];
    if ((((iVar7 == 0) && (aiStack_154[lVar20 + 2] == 0)) &&
        ((aiStack_154[lVar20 + 3] == 0 &&
         (((aiStack_154[lVar20 + 4] == 0 && (aiStack_154[lVar20 + 5] == 0)) &&
          (aiStack_154[lVar20 + 6] == 0)))))) && (aiStack_154[lVar20 + 7] == 0)) {
      JVar9 = pJVar4[(ulong)(aiStack_154[lVar20] + 0x10U >> 5 & 0x3ff) + 0x80];
      *pJVar17 = JVar9;
      pJVar17[1] = JVar9;
      pJVar17[2] = JVar9;
      pJVar17[3] = JVar9;
      pJVar17[4] = JVar9;
      pJVar17[5] = JVar9;
      pJVar17[6] = JVar9;
      lVar11 = 7;
    }
    else {
      iVar18 = (aiStack_154[lVar20 + 6] + aiStack_154[lVar20 + 2]) * 0x1151;
      iVar6 = aiStack_154[lVar20 + 2] * 0x187e + iVar18;
      iVar18 = aiStack_154[lVar20 + 6] * -0x3b21 + iVar18;
      iVar19 = (aiStack_154[lVar20] + aiStack_154[lVar20 + 4] + 0x10) * 0x2000;
      iVar21 = ((aiStack_154[lVar20] + 0x10) - aiStack_154[lVar20 + 4]) * 0x2000;
      iVar1 = iVar19 + iVar6;
      iVar19 = iVar19 - iVar6;
      iVar6 = iVar21 + iVar18;
      iVar21 = iVar21 - iVar18;
      iVar18 = aiStack_154[lVar20 + 7];
      iVar2 = aiStack_154[lVar20 + 5];
      iVar3 = aiStack_154[lVar20 + 3];
      iVar12 = (iVar18 + iVar3 + iVar2 + iVar7) * 0x25a1;
      iVar10 = (iVar18 + iVar3) * -0x3ec5 + iVar12;
      iVar12 = (iVar2 + iVar7) * -0xc7c + iVar12;
      iVar14 = (iVar18 + iVar7) * -0x1ccd;
      iVar18 = iVar18 * 0x98e + iVar14 + iVar10;
      iVar14 = iVar7 * 0x300b + iVar14 + iVar12;
      iVar7 = (iVar2 + iVar3) * -0x5203;
      iVar12 = iVar2 * 0x41b3 + iVar7 + iVar12;
      iVar10 = iVar3 * 0x6254 + iVar7 + iVar10;
      *pJVar17 = pJVar4[(ulong)((uint)(iVar1 + iVar14) >> 0x12 & 0x3ff) + 0x80];
      pJVar17[7] = pJVar4[(ulong)((uint)(iVar1 - iVar14) >> 0x12 & 0x3ff) + 0x80];
      pJVar17[1] = pJVar4[(ulong)((uint)(iVar10 + iVar6) >> 0x12 & 0x3ff) + 0x80];
      pJVar17[6] = pJVar4[(ulong)((uint)(iVar6 - iVar10) >> 0x12 & 0x3ff) + 0x80];
      pJVar17[2] = pJVar4[(ulong)((uint)(iVar12 + iVar21) >> 0x12 & 0x3ff) + 0x80];
      pJVar17[5] = pJVar4[(ulong)((uint)(iVar21 - iVar12) >> 0x12 & 0x3ff) + 0x80];
      pJVar17[3] = pJVar4[(ulong)((uint)(iVar18 + iVar19) >> 0x12 & 0x3ff) + 0x80];
      JVar9 = pJVar4[(ulong)((uint)(iVar19 - iVar18) >> 0x12 & 0x3ff) + 0x80];
      lVar11 = 4;
    }
    pJVar17[lVar11] = JVar9;
    lVar20 = lVar20 + 8;
  } while (lVar20 != 0x47);
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_islow (j_decompress_ptr cinfo, jpeg_component_info * compptr,
		 JCOEFPTR coef_block,
		 JSAMPARRAY output_buf, JDIMENSION output_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3;
  INT32 tmp10, tmp11, tmp12, tmp13;
  INT32 z1, z2, z3;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE * quantptr;
  int * wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[DCTSIZE2];	/* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */
  /* Note results are scaled up by sqrt(8) compared to a true IDCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *) compptr->dct_table;
  wsptr = workspace;
  for (ctr = DCTSIZE; ctr > 0; ctr--) {
    /* Due to quantization, we will usually find that many of the input
     * coefficients are zero, especially the AC terms.  We can exploit this
     * by short-circuiting the IDCT calculation for any column in which all
     * the AC terms are zero.  In that case each output is equal to the
     * DC coefficient (with scale factor as needed).
     * With typical images and quantization tables, half or more of the
     * column DCT calculations can be simplified this way.
     */

    if (inptr[DCTSIZE*1] == 0 && inptr[DCTSIZE*2] == 0 &&
	inptr[DCTSIZE*3] == 0 && inptr[DCTSIZE*4] == 0 &&
	inptr[DCTSIZE*5] == 0 && inptr[DCTSIZE*6] == 0 &&
	inptr[DCTSIZE*7] == 0) {
      /* AC terms all zero */
      int dcval = DEQUANTIZE(inptr[DCTSIZE*0], quantptr[DCTSIZE*0]) << PASS1_BITS;

      wsptr[DCTSIZE*0] = dcval;
      wsptr[DCTSIZE*1] = dcval;
      wsptr[DCTSIZE*2] = dcval;
      wsptr[DCTSIZE*3] = dcval;
      wsptr[DCTSIZE*4] = dcval;
      wsptr[DCTSIZE*5] = dcval;
      wsptr[DCTSIZE*6] = dcval;
      wsptr[DCTSIZE*7] = dcval;

      inptr++;			/* advance pointers to next column */
      quantptr++;
      wsptr++;
      continue;
    }

    /* Even part: reverse the even part of the forward DCT. */
    /* The rotator is sqrt(2)*c(-6). */
    
    z2 = DEQUANTIZE(inptr[DCTSIZE*2], quantptr[DCTSIZE*2]);
    z3 = DEQUANTIZE(inptr[DCTSIZE*6], quantptr[DCTSIZE*6]);

    z1 = MULTIPLY(z2 + z3, FIX_0_541196100);
    tmp2 = z1 + MULTIPLY(z2, FIX_0_765366865);
    tmp3 = z1 - MULTIPLY(z3, FIX_1_847759065);

    z2 = DEQUANTIZE(inptr[DCTSIZE*0], quantptr[DCTSIZE*0]);
    z3 = DEQUANTIZE(inptr[DCTSIZE*4], quantptr[DCTSIZE*4]);
    z2 <<= CONST_BITS;
    z3 <<= CONST_BITS;
    /* Add fudge factor here for final descale. */
    z2 += ONE << (CONST_BITS-PASS1_BITS-1);

    tmp0 = z2 + z3;
    tmp1 = z2 - z3;

    tmp10 = tmp0 + tmp2;
    tmp13 = tmp0 - tmp2;
    tmp11 = tmp1 + tmp3;
    tmp12 = tmp1 - tmp3;

    /* Odd part per figure 8; the matrix is unitary and hence its
     * transpose is its inverse.  i0..i3 are y7,y5,y3,y1 respectively.
     */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE*7], quantptr[DCTSIZE*7]);
    tmp1 = DEQUANTIZE(inptr[DCTSIZE*5], quantptr[DCTSIZE*5]);
    tmp2 = DEQUANTIZE(inptr[DCTSIZE*3], quantptr[DCTSIZE*3]);
    tmp3 = DEQUANTIZE(inptr[DCTSIZE*1], quantptr[DCTSIZE*1]);
    
    z2 = tmp0 + tmp2;
    z3 = tmp1 + tmp3;

    z1 = MULTIPLY(z2 + z3, FIX_1_175875602); /* sqrt(2) * c3 */
    z2 = MULTIPLY(z2, - FIX_1_961570560); /* sqrt(2) * (-c3-c5) */
    z3 = MULTIPLY(z3, - FIX_0_390180644); /* sqrt(2) * (c5-c3) */
    z2 += z1;
    z3 += z1;

    z1 = MULTIPLY(tmp0 + tmp3, - FIX_0_899976223); /* sqrt(2) * (c7-c3) */
    tmp0 = MULTIPLY(tmp0, FIX_0_298631336); /* sqrt(2) * (-c1+c3+c5-c7) */
    tmp3 = MULTIPLY(tmp3, FIX_1_501321110); /* sqrt(2) * ( c1+c3-c5-c7) */
    tmp0 += z1 + z2;
    tmp3 += z1 + z3;

    z1 = MULTIPLY(tmp1 + tmp2, - FIX_2_562915447); /* sqrt(2) * (-c1-c3) */
    tmp1 = MULTIPLY(tmp1, FIX_2_053119869); /* sqrt(2) * ( c1+c3-c5+c7) */
    tmp2 = MULTIPLY(tmp2, FIX_3_072711026); /* sqrt(2) * ( c1+c3+c5-c7) */
    tmp1 += z1 + z3;
    tmp2 += z1 + z2;

    /* Final output stage: inputs are tmp10..tmp13, tmp0..tmp3 */

    wsptr[DCTSIZE*0] = (int) RIGHT_SHIFT(tmp10 + tmp3, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*7] = (int) RIGHT_SHIFT(tmp10 - tmp3, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*1] = (int) RIGHT_SHIFT(tmp11 + tmp2, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*6] = (int) RIGHT_SHIFT(tmp11 - tmp2, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*2] = (int) RIGHT_SHIFT(tmp12 + tmp1, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*5] = (int) RIGHT_SHIFT(tmp12 - tmp1, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*3] = (int) RIGHT_SHIFT(tmp13 + tmp0, CONST_BITS-PASS1_BITS);
    wsptr[DCTSIZE*4] = (int) RIGHT_SHIFT(tmp13 - tmp0, CONST_BITS-PASS1_BITS);
    
    inptr++;			/* advance pointers to next column */
    quantptr++;
    wsptr++;
  }

  /* Pass 2: process rows from work array, store into output array. */
  /* Note that we must descale the results by a factor of 8 == 2**3, */
  /* and also undo the PASS1_BITS scaling. */

  wsptr = workspace;
  for (ctr = 0; ctr < DCTSIZE; ctr++) {
    outptr = output_buf[ctr] + output_col;
    /* Rows of zeroes can be exploited in the same way as we did with columns.
     * However, the column calculation has created many nonzero AC terms, so
     * the simplification applies less often (typically 5% to 10% of the time).
     * On machines with very fast multiplication, it's possible that the
     * test takes more time than it's worth.  In that case this section
     * may be commented out.
     */

#ifndef NO_ZERO_ROW_TEST
    if (wsptr[1] == 0 && wsptr[2] == 0 && wsptr[3] == 0 && wsptr[4] == 0 &&
	wsptr[5] == 0 && wsptr[6] == 0 && wsptr[7] == 0) {
      /* AC terms all zero */
      JSAMPLE dcval = range_limit[(int) DESCALE((INT32) wsptr[0], PASS1_BITS+3)
				  & RANGE_MASK];

      outptr[0] = dcval;
      outptr[1] = dcval;
      outptr[2] = dcval;
      outptr[3] = dcval;
      outptr[4] = dcval;
      outptr[5] = dcval;
      outptr[6] = dcval;
      outptr[7] = dcval;

      wsptr += DCTSIZE;		/* advance pointer to next row */
      continue;
    }
#endif

    /* Even part: reverse the even part of the forward DCT. */
    /* The rotator is sqrt(2)*c(-6). */
    
    z2 = (INT32) wsptr[2];
    z3 = (INT32) wsptr[6];

    z1 = MULTIPLY(z2 + z3, FIX_0_541196100);
    tmp2 = z1 + MULTIPLY(z2, FIX_0_765366865);
    tmp3 = z1 - MULTIPLY(z3, FIX_1_847759065);

    /* Add fudge factor here for final descale. */
    z2 = (INT32) wsptr[0] + (ONE << (PASS1_BITS+2));
    z3 = (INT32) wsptr[4];

    tmp0 = (z2 + z3) << CONST_BITS;
    tmp1 = (z2 - z3) << CONST_BITS;
    
    tmp10 = tmp0 + tmp2;
    tmp13 = tmp0 - tmp2;
    tmp11 = tmp1 + tmp3;
    tmp12 = tmp1 - tmp3;

    /* Odd part per figure 8; the matrix is unitary and hence its
     * transpose is its inverse.  i0..i3 are y7,y5,y3,y1 respectively.
     */

    tmp0 = (INT32) wsptr[7];
    tmp1 = (INT32) wsptr[5];
    tmp2 = (INT32) wsptr[3];
    tmp3 = (INT32) wsptr[1];

    z2 = tmp0 + tmp2;
    z3 = tmp1 + tmp3;

    z1 = MULTIPLY(z2 + z3, FIX_1_175875602); /* sqrt(2) * c3 */
    z2 = MULTIPLY(z2, - FIX_1_961570560); /* sqrt(2) * (-c3-c5) */
    z3 = MULTIPLY(z3, - FIX_0_390180644); /* sqrt(2) * (c5-c3) */
    z2 += z1;
    z3 += z1;

    z1 = MULTIPLY(tmp0 + tmp3, - FIX_0_899976223); /* sqrt(2) * (c7-c3) */
    tmp0 = MULTIPLY(tmp0, FIX_0_298631336); /* sqrt(2) * (-c1+c3+c5-c7) */
    tmp3 = MULTIPLY(tmp3, FIX_1_501321110); /* sqrt(2) * ( c1+c3-c5-c7) */
    tmp0 += z1 + z2;
    tmp3 += z1 + z3;

    z1 = MULTIPLY(tmp1 + tmp2, - FIX_2_562915447); /* sqrt(2) * (-c1-c3) */
    tmp1 = MULTIPLY(tmp1, FIX_2_053119869); /* sqrt(2) * ( c1+c3-c5+c7) */
    tmp2 = MULTIPLY(tmp2, FIX_3_072711026); /* sqrt(2) * ( c1+c3+c5-c7) */
    tmp1 += z1 + z3;
    tmp2 += z1 + z2;

    /* Final output stage: inputs are tmp10..tmp13, tmp0..tmp3 */

    outptr[0] = range_limit[(int) RIGHT_SHIFT(tmp10 + tmp3,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[7] = range_limit[(int) RIGHT_SHIFT(tmp10 - tmp3,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[1] = range_limit[(int) RIGHT_SHIFT(tmp11 + tmp2,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[6] = range_limit[(int) RIGHT_SHIFT(tmp11 - tmp2,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[2] = range_limit[(int) RIGHT_SHIFT(tmp12 + tmp1,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[5] = range_limit[(int) RIGHT_SHIFT(tmp12 - tmp1,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[3] = range_limit[(int) RIGHT_SHIFT(tmp13 + tmp0,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[4] = range_limit[(int) RIGHT_SHIFT(tmp13 - tmp0,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];

    wsptr += DCTSIZE;		/* advance pointer to next row */
  }
}